

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenerators::SearchHeadersForCppFile
          (cmQtAutoGenerators *this,string *absFilename,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *headerExtensions,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *absHeaders)

{
  bool bVar1;
  pointer pbVar2;
  string headerName;
  string local_b0;
  string absPath;
  string basename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cmsys::SystemTools::GetFilenameWithoutLastExtension(&basename,absFilename);
  cmsys::SystemTools::GetRealPath(&local_b0,absFilename,(string *)0x0);
  cmsys::SystemTools::GetFilenamePath(&headerName,&local_b0);
  std::operator+(&absPath,&headerName,'/');
  std::__cxx11::string::~string((string *)&headerName);
  std::__cxx11::string::~string((string *)&local_b0);
  for (pbVar2 = (headerExtensions->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != (headerExtensions->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    std::operator+(&local_50,&absPath,&basename);
    std::operator+(&local_b0,&local_50,".");
    std::operator+(&headerName,&local_b0,pbVar2);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    bVar1 = cmsys::SystemTools::FileExists(headerName._M_dataplus._M_p);
    if (bVar1) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)absHeaders,&headerName);
      std::__cxx11::string::~string((string *)&headerName);
      break;
    }
    std::__cxx11::string::~string((string *)&headerName);
  }
  pbVar2 = (headerExtensions->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar2 == (headerExtensions->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
LAB_0029b906:
      std::__cxx11::string::~string((string *)&absPath);
      std::__cxx11::string::~string((string *)&basename);
      return;
    }
    std::operator+(&local_50,&absPath,&basename);
    std::operator+(&local_b0,&local_50,"_p.");
    std::operator+(&headerName,&local_b0,pbVar2);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    bVar1 = cmsys::SystemTools::FileExists(headerName._M_dataplus._M_p);
    if (bVar1) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)absHeaders,&headerName);
      std::__cxx11::string::~string((string *)&headerName);
      goto LAB_0029b906;
    }
    std::__cxx11::string::~string((string *)&headerName);
    pbVar2 = pbVar2 + 1;
  } while( true );
}

Assistant:

void
cmQtAutoGenerators::SearchHeadersForCppFile(const std::string& absFilename,
                              const std::vector<std::string>& headerExtensions,
                              std::set<std::string>& absHeaders)
{
  // search for header files and private header files we may need to moc:
  const std::string basename =
              cmsys::SystemTools::GetFilenameWithoutLastExtension(absFilename);
  const std::string absPath = cmsys::SystemTools::GetFilenamePath(
                   cmsys::SystemTools::GetRealPath(absFilename)) + '/';

  for(std::vector<std::string>::const_iterator ext = headerExtensions.begin();
      ext != headerExtensions.end();
      ++ext)
    {
    const std::string headerName = absPath + basename + "." + (*ext);
    if (cmsys::SystemTools::FileExists(headerName.c_str()))
      {
      absHeaders.insert(headerName);
      break;
      }
    }
  for(std::vector<std::string>::const_iterator ext = headerExtensions.begin();
      ext != headerExtensions.end();
      ++ext)
    {
    const std::string privateHeaderName = absPath+basename+"_p."+(*ext);
    if (cmsys::SystemTools::FileExists(privateHeaderName.c_str()))
      {
      absHeaders.insert(privateHeaderName);
      break;
      }
    }

}